

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.c
# Opt level: O0

Symbol * elf_bssentry(GlobalVars *gv,char *secname,Symbol *xdef,bool relaflag,size_t relocsize,
                     size_t addrsize)

{
  long lVar1;
  Section *rs;
  Reloc *pRVar2;
  undefined4 in_ECX;
  Section *in_RDX;
  undefined8 in_RSI;
  Reloc *in_RDI;
  Section *in_R8;
  Section *in_R9;
  ObjectUnit *unaff_retaddr;
  Reloc *r;
  Symbol *newxdef;
  Symbol *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  ObjectUnit *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffe0;
  int relafmt;
  
  lVar1._0_1_ = in_RDI[7].rtype;
  lVar1._1_1_ = in_RDI[7].flags;
  lVar1._2_6_ = *(undefined6 *)&in_RDI[7].field_0x3a;
  if (lVar1 == 0) {
    ierror("elf_bssentry(): no dynobj");
  }
  rs = (Section *)
       bss_entry(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  if (rs != (Section *)0x0) {
    in_RDX = rs;
    pRVar2 = newreloc((GlobalVars *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),in_R8,(char *)in_R9,
                      rs,(uint32_t)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                      (unsigned_long)in_stack_ffffffffffffffb8,(uint8_t)in_RSI,(lword)in_RDI);
    relafmt = (int)((ulong)in_RSI >> 0x20);
    (pRVar2->relocsect).ptr = in_RDX;
    addreloc(in_R9,(Reloc *)rs,(uint16_t)((ulong)pRVar2 >> 0x30),(uint16_t)((ulong)pRVar2 >> 0x20),
             (lword)in_stack_ffffffffffffffb8);
    elf_dynreloc(unaff_retaddr,in_RDI,relafmt,(size_t)in_RDX);
  }
  return (Symbol *)in_RDX;
}

Assistant:

struct Symbol *elf_bssentry(struct GlobalVars *gv,const char *secname,
                            struct Symbol *xdef,bool relaflag,
                            size_t relocsize,size_t addrsize)
/* Allocate space for a copy-object in a .bss or .sbss section and create
   a R_COPY relocation to the original symbol in the shared object. */
{
  struct Symbol *newxdef;

  if (gv->dynobj == NULL)
    ierror("elf_bssentry(): no dynobj");
  newxdef = bss_entry(gv->dynobj,secname,xdef);

  if (newxdef) {
    /* entry in BSS was done, so we need a R_COPY relocation */
    struct Reloc *r;

    xdef = newxdef;
    r = newreloc(gv,xdef->relsect,xdef->name,NULL,0,0,R_COPY,0);
    r->relocsect.symbol = xdef;
    addreloc(xdef->relsect,r,0,addrsize,-1);  /* mask/size irrel. for R_COPY */
    elf_dynreloc(xdef->relsect->obj,r,relaflag,relocsize);
  }

  return xdef;
}